

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O2

int ARGBAdd(uint8_t *src_argb0,int src_stride_argb0,uint8_t *src_argb1,int src_stride_argb1,
           uint8_t *dst_argb,int dst_stride_argb,int width,int height)

{
  int iVar1;
  int iVar2;
  code *pcVar3;
  code *pcVar4;
  bool bVar5;
  int local_4c;
  
  if (height == 0 ||
      (width < 1 ||
      (dst_argb == (uint8_t *)0x0 || (src_argb1 == (uint8_t *)0x0 || src_argb0 == (uint8_t *)0x0))))
  {
    iVar1 = -1;
  }
  else {
    iVar1 = height;
    if (height < 0) {
      iVar1 = -height;
      dst_argb = dst_argb + ~height * dst_stride_argb;
      dst_stride_argb = -dst_stride_argb;
    }
    iVar2 = width * 4;
    local_4c = src_stride_argb0;
    if ((iVar2 == src_stride_argb1 && iVar2 == src_stride_argb0) && dst_stride_argb == iVar2) {
      width = iVar1 * width;
      iVar1 = 1;
      local_4c = 0;
      src_stride_argb1 = 0;
      dst_stride_argb = 0;
    }
    iVar2 = libyuv::TestCpuFlag(0x20);
    if ((width & 3U) == 0) {
      pcVar3 = ARGBAddRow_SSE2;
    }
    else {
      pcVar3 = ARGBAddRow_Any_SSE2;
    }
    if (iVar2 == 0) {
      pcVar3 = ARGBAddRow_C;
    }
    iVar2 = libyuv::TestCpuFlag(0x400);
    if ((width & 7U) == 0) {
      pcVar4 = ARGBAddRow_AVX2;
    }
    else {
      pcVar4 = ARGBAddRow_Any_AVX2;
    }
    if (iVar2 == 0) {
      pcVar4 = pcVar3;
    }
    while (bVar5 = iVar1 != 0, iVar1 = iVar1 + -1, bVar5) {
      (*pcVar4)(src_argb0,src_argb1,dst_argb,width);
      src_argb0 = src_argb0 + local_4c;
      src_argb1 = src_argb1 + src_stride_argb1;
      dst_argb = dst_argb + dst_stride_argb;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int ARGBAdd(const uint8_t* src_argb0,
            int src_stride_argb0,
            const uint8_t* src_argb1,
            int src_stride_argb1,
            uint8_t* dst_argb,
            int dst_stride_argb,
            int width,
            int height) {
  int y;
  void (*ARGBAddRow)(const uint8_t* src0, const uint8_t* src1, uint8_t* dst,
                     int width) = ARGBAddRow_C;
  if (!src_argb0 || !src_argb1 || !dst_argb || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_argb = dst_argb + (height - 1) * dst_stride_argb;
    dst_stride_argb = -dst_stride_argb;
  }
  // Coalesce rows.
  if (src_stride_argb0 == width * 4 && src_stride_argb1 == width * 4 &&
      dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    src_stride_argb0 = src_stride_argb1 = dst_stride_argb = 0;
  }
#if defined(HAS_ARGBADDROW_SSE2) && (defined(_MSC_VER) && !defined(__clang__))
  if (TestCpuFlag(kCpuHasSSE2)) {
    ARGBAddRow = ARGBAddRow_SSE2;
  }
#endif
#if defined(HAS_ARGBADDROW_SSE2) && !(defined(_MSC_VER) && !defined(__clang__))
  if (TestCpuFlag(kCpuHasSSE2)) {
    ARGBAddRow = ARGBAddRow_Any_SSE2;
    if (IS_ALIGNED(width, 4)) {
      ARGBAddRow = ARGBAddRow_SSE2;
    }
  }
#endif
#if defined(HAS_ARGBADDROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    ARGBAddRow = ARGBAddRow_Any_AVX2;
    if (IS_ALIGNED(width, 8)) {
      ARGBAddRow = ARGBAddRow_AVX2;
    }
  }
#endif
#if defined(HAS_ARGBADDROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    ARGBAddRow = ARGBAddRow_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      ARGBAddRow = ARGBAddRow_NEON;
    }
  }
#endif
#if defined(HAS_ARGBADDROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    ARGBAddRow = ARGBAddRow_Any_MMI;
    if (IS_ALIGNED(width, 2)) {
      ARGBAddRow = ARGBAddRow_MMI;
    }
  }
#endif
#if defined(HAS_ARGBADDROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    ARGBAddRow = ARGBAddRow_Any_MSA;
    if (IS_ALIGNED(width, 8)) {
      ARGBAddRow = ARGBAddRow_MSA;
    }
  }
#endif

  // Add plane
  for (y = 0; y < height; ++y) {
    ARGBAddRow(src_argb0, src_argb1, dst_argb, width);
    src_argb0 += src_stride_argb0;
    src_argb1 += src_stride_argb1;
    dst_argb += dst_stride_argb;
  }
  return 0;
}